

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O1

NodeFS * __thiscall NodeFS::InsertNode(NodeFS *this,string *node_name)

{
  pointer *pppNVar1;
  pointer ppNVar2;
  size_t sVar3;
  size_t __n;
  iterator __position;
  int iVar4;
  pointer ppNVar5;
  NodeFS *unaff_R15;
  bool bVar6;
  NodeFS *new_node;
  NodeFS *local_40;
  NodeFS *local_38;
  
  ppNVar5 = (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar2 = (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar6 = ppNVar5 == ppNVar2;
  local_40 = unaff_R15;
  local_38 = this;
  if (!bVar6) {
    sVar3 = node_name->_M_string_length;
    do {
      local_40 = *ppNVar5;
      __n = (local_40->name_)._M_string_length;
      if ((__n == sVar3) &&
         ((__n == 0 ||
          (iVar4 = bcmp((local_40->name_)._M_dataplus._M_p,(node_name->_M_dataplus)._M_p,__n),
          iVar4 == 0)))) break;
      ppNVar5 = ppNVar5 + 1;
      bVar6 = ppNVar5 == ppNVar2;
    } while (!bVar6);
  }
  if (bVar6) {
    local_40 = (NodeFS *)operator_new(0x68);
    local_40->_vptr_NodeFS = (_func_int **)&PTR__NodeFS_001ce4b0;
    (local_40->name_)._M_dataplus._M_p = (pointer)&(local_40->name_).field_2;
    (local_40->name_)._M_string_length = 0;
    (local_40->name_).field_2._M_local_buf[0] = '\0';
    (local_40->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_40->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_40->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40->offset_ = 0;
    local_40->buffer_ = (uchar *)0x0;
    local_40->type_ = -1;
    std::__cxx11::string::_M_assign((string *)&local_40->name_);
    local_40->is_leaf_ = false;
    __position._M_current =
         (local_38->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_38->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<NodeFS*,std::allocator<NodeFS*>>::_M_realloc_insert<NodeFS*const&>
                ((vector<NodeFS*,std::allocator<NodeFS*>> *)&local_38->sub_node_,__position,
                 &local_40);
    }
    else {
      *__position._M_current = local_40;
      pppNVar1 = &(local_38->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  return local_40;
}

Assistant:

NodeFS* NodeFS::InsertNode(std::string node_name)
{
   // Look for node : Already exists ?
   for (std::vector<NodeFS*>::iterator it = sub_node_.begin(); it != sub_node_.end(); ++it)
   {
      if ((*it)->name_ == node_name)
         return *it;
   }
   // It does not exists
   NodeFS* new_node = new NodeFS;
   new_node->name_ = node_name;
   new_node->is_leaf_ = false;
   sub_node_.push_back(new_node);

   return new_node;
}